

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O0

void __thiscall Liby::PollerEpoll::PollerEpoll(PollerEpoll *this)

{
  int iVar1;
  Logger *this_00;
  int *piVar2;
  double __x;
  shared_ptr<Liby::FileDescriptor> local_30 [2];
  PollerEpoll *local_10;
  PollerEpoll *this_local;
  
  local_10 = this;
  Poller::Poller(&this->super_Poller);
  (this->super_Poller)._vptr_Poller = (_func_int **)&PTR__PollerEpoll_00195478;
  this->pollerfd_ = -1;
  this->eventsSize_ = 0;
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr(&this->pollerfp_);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->events_);
  iVar1 = epoll_create1(0x80000);
  this->pollerfd_ = iVar1;
  if (this->pollerfd_ < 1) {
    this_00 = Logger::getLogger();
    piVar2 = __errno_location();
    strerror(*piVar2);
    Logger::log(this_00,__x);
    exit(1);
  }
  std::make_shared<Liby::FileDescriptor,int&>((int *)local_30);
  std::shared_ptr<Liby::FileDescriptor>::operator=(&this->pollerfp_,local_30);
  std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(local_30);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::resize(&this->events_,0x30);
  return;
}

Assistant:

PollerEpoll::PollerEpoll() {
    pollerfd_ = ::epoll_create1(EPOLL_CLOEXEC);
    fatalif(pollerfd_ <= 0, "%s", ::strerror(errno));
    pollerfp_ = std::make_shared<FileDescriptor>(pollerfd_);

    events_.resize(defaultEpollSize);
}